

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O2

void tick_prog_academy_reset(AREA_DATA_conflict *area)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  ROOM_INDEX_DATA *pRoomIndex;
  CHAR_DATA **ch;
  char buf [4608];
  char local_1238 [4616];
  
  ch = &char_list;
  while (ch = &((CHAR_DATA *)ch)->next->next, (CHAR_DATA *)ch != (CHAR_DATA *)0x0) {
    bVar2 = is_npc((CHAR_DATA *)ch);
    if ((((!bVar2) && (((CHAR_DATA *)ch)->in_room->area == area)) && (10 < ((CHAR_DATA *)ch)->level)
        ) && ((((CHAR_DATA *)ch)->fighting == (CHAR_DATA *)0x0 &&
              (bVar2 = is_immortal((CHAR_DATA *)ch), !bVar2)))) {
      send_to_char("A small contingent of guards rapidly marches up to you.\n\r",(CHAR_DATA *)ch);
      act("A small contingent of guards rapidly marches up to $n, marching $m off.",(CHAR_DATA *)ch,
          (void *)0x0,(void *)0x0,0);
      pcVar4 = get_char_color((CHAR_DATA *)ch,"speech");
      pcVar5 = END_COLOR((CHAR_DATA *)ch);
      sprintf(local_1238,
              "A Royal Academy Guard says \'%sBy the orders of the King, you have completed your training and must depart.%s\'\n\r"
              ,pcVar4,pcVar5);
      send_to_char(local_1238,(CHAR_DATA *)ch);
      send_to_char("The guards lead you to the exit of the Academy.\n\r",(CHAR_DATA *)ch);
      do_look((CHAR_DATA *)ch,"auto");
      pcVar4 = get_char_color((CHAR_DATA *)ch,"speech");
      pcVar5 = END_COLOR((CHAR_DATA *)ch);
      sprintf(local_1238,
              "A Royal Academy Guard says \'%sThe King allows a small reward for the completion of your training here.%s\'\n\r"
              ,pcVar4,pcVar5);
      send_to_char(local_1238,(CHAR_DATA *)ch);
      send_to_char("A Royal Academy Guard gives you 25 gold.\n\r",(CHAR_DATA *)ch);
      ((CHAR_DATA *)ch)->gold = ((CHAR_DATA *)ch)->gold + 0x19;
      char_from_room((CHAR_DATA *)ch);
      pRoomIndex = get_room_index(0x9ea);
      char_to_room((CHAR_DATA *)ch,pRoomIndex);
      pcVar4 = get_char_color((CHAR_DATA *)ch,"speech");
      is_good((CHAR_DATA *)ch);
      END_COLOR((CHAR_DATA *)ch);
      sprintf(local_1238,
              "A Royal Academy Guard says \'%sA tip from me: if you\'re looking to learn further, I might try %s.%s\'\n\r"
              ,pcVar4);
      send_to_char(local_1238,(CHAR_DATA *)ch);
    }
  }
  sVar1 = area->age;
  if ((ushort)(sVar1 - 3U) < 3) {
    iVar3 = number_percent();
    if (0x32 < iVar3) goto LAB_0034ea5c;
    sVar1 = area->age;
  }
  if (sVar1 < 6) {
    return;
  }
LAB_0034ea5c:
  reset_area(area);
  return;
}

Assistant:

void tick_prog_academy_reset(AREA_DATA *area)
{
	CHAR_DATA *ch;

	for (ch = char_list; ch; ch = ch->next)
	{
		if (!is_npc(ch) && ch->in_room->area == area && ch->level > 10 && !ch->fighting && !is_immortal(ch))
		{
			char buf[MSL];

			send_to_char("A small contingent of guards rapidly marches up to you.\n\r", ch);
			act("A small contingent of guards rapidly marches up to $n, marching $m off.", ch, 0, 0, TO_ROOM);

			sprintf(buf, "A Royal Academy Guard says '%sBy the orders of the King, you have completed your training and must depart.%s'\n\r",
				get_char_color(ch, "speech"),
				END_COLOR(ch));
			send_to_char(buf, ch);
			send_to_char("The guards lead you to the exit of the Academy.\n\r", ch);

			do_look(ch, "auto");
			sprintf(buf, "A Royal Academy Guard says '%sThe King allows a small reward for the completion of your training here.%s'\n\r",
				get_char_color(ch, "speech"),
				END_COLOR(ch));
			send_to_char(buf, ch);
			send_to_char("A Royal Academy Guard gives you 25 gold.\n\r", ch);

			ch->gold += 25;

			char_from_room(ch);
			char_to_room(ch, get_room_index(ROOM_VNUM_TEMPLE));

			sprintf(buf, "A Royal Academy Guard says '%sA tip from me: if you're looking to learn further, I might try %s.%s'\n\r",
				get_char_color(ch, "speech"),
				is_good(ch)
					? "the parrots in the forest off of the road south of Cimar or the trolls in the forests off the Great Shalaran Road"
					: "the parrots in the forest off of the road south of Cimar or the pixies in the Emerald Forest off the Melcene Plains Road",
				END_COLOR(ch));
			send_to_char(buf, ch);
		}
	}

	if (area->age > 2 && area->age < 6)
	{
		if (number_percent() > 50)
		{
			reset_area(area);
			return;
		}
	}

	if (area->age >= 6)
		reset_area(area);

	/*
	for ( ch->level = ch->level ; ch->level < 25; ch->level++ )
	{
		advance_level( ch,false);
	}
	ch->exp = exp_per_level(ch) * (ch->level - 1);
	*/
}